

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O1

void CheckColor(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  char cVar1;
  TidyAllocator *pTVar2;
  _func_void_ptr_TidyAllocator_ptr_size_t *p_Var3;
  uint uVar4;
  Bool BVar5;
  uint uVar6;
  int iVar7;
  tmbstr ptVar8;
  long lVar9;
  ctmbstr color;
  long lVar10;
  _colors *p_Var11;
  char *str;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  
  if ((attval == (AttVal *)0x0) || (color = attval->value, color == (ctmbstr)0x0)) {
    uVar6 = 0x256;
    goto LAB_0013e009;
  }
  bVar14 = true;
  if ((*color != '#') && (BVar5 = IsValidColorCode(color), BVar5 != no)) {
    pTVar2 = doc->allocator;
    p_Var3 = pTVar2->vtbl->alloc;
    uVar6 = prvTidytmbstrlen(color);
    ptVar8 = (tmbstr)(*p_Var3)(pTVar2,(long)uVar6 + 2);
    *ptVar8 = '#';
    lVar9 = 1;
    do {
      cVar1 = color[lVar9 + -1];
      ptVar8[lVar9] = cVar1;
      lVar9 = lVar9 + 1;
    } while (cVar1 != '\0');
    prvTidyReportAttrError(doc,node,attval,0x22a);
    (*doc->allocator->vtbl->free)(doc->allocator,attval->value);
    attval->value = ptVar8;
    bVar14 = false;
    color = ptVar8;
  }
  if (bVar14) {
    bVar14 = true;
    if (*color == '#') {
      BVar5 = IsValidColorCode(color + 1);
      bVar14 = BVar5 == no;
    }
  }
  else {
    bVar14 = false;
  }
  if (((!bVar14) && (*color == '#')) && (*(int *)((doc->config).value + 0x48) != 0)) {
    BVar5 = prvTidyIsHTML5Mode(doc);
    iVar7 = prvTidytmbstrcasecmp(color,"#000000");
    if (iVar7 == 0) {
      str = "black";
    }
    else {
      lVar9 = 0;
      do {
        lVar10 = lVar9;
        if (lVar10 + 0x10 == 0x100) {
          if (BVar5 == no) {
            str = (ctmbstr)0x0;
            goto LAB_0013df23;
          }
          iVar7 = prvTidytmbstrcasecmp(color,"#f0f8ff");
          if (iVar7 != 0) {
            uVar13 = 1;
            goto LAB_0013dee3;
          }
          str = "aliceblue";
          goto LAB_0013df23;
        }
        iVar7 = prvTidytmbstrcasecmp(color,*(ctmbstr *)((long)&colors[1].hex + lVar10));
        lVar9 = lVar10 + 0x10;
      } while (iVar7 != 0);
      str = *(char **)((long)&colors[1].name + lVar10);
    }
    goto LAB_0013df23;
  }
  goto LAB_0013df5b;
  while( true ) {
    iVar7 = prvTidytmbstrcasecmp(color,extended_colors[uVar12].name);
    uVar4 = uVar12 + 1;
    if (iVar7 == 0) break;
LAB_0013e05a:
    uVar12 = uVar4;
    if (extended_colors[uVar12].name == (ctmbstr)0x0) goto LAB_0013dfcd;
  }
  p_Var11 = extended_colors + uVar12;
  goto LAB_0013dfc4;
  while( true ) {
    iVar7 = prvTidytmbstrcasecmp(color,extended_colors[uVar13].hex);
    uVar13 = (ulong)((int)uVar13 + 1);
    if (iVar7 == 0) break;
LAB_0013dee3:
    str = extended_colors[uVar13].name;
    if (str == (ctmbstr)0x0) {
      str = (ctmbstr)0x0;
      break;
    }
  }
LAB_0013df23:
  if (str != (ctmbstr)0x0) {
    (*doc->allocator->vtbl->free)(doc->allocator,attval->value);
    color = prvTidytmbstrdup(doc->allocator,str);
    attval->value = color;
  }
LAB_0013df5b:
  if (bVar14) {
    BVar5 = prvTidyIsHTML5Mode(doc);
    iVar7 = prvTidytmbstrcasecmp(color,"black");
    if (iVar7 == 0) {
      p_Var11 = colors;
    }
    else {
      lVar9 = 0;
      do {
        lVar10 = lVar9;
        if (lVar10 + 0x10 == 0x100) {
          bVar14 = true;
          if (BVar5 == no) goto LAB_0013dfcd;
          iVar7 = prvTidytmbstrcasecmp(color,"aliceblue");
          if (iVar7 != 0) {
            uVar4 = 1;
            goto LAB_0013e05a;
          }
          p_Var11 = extended_colors;
          goto LAB_0013dfc4;
        }
        iVar7 = prvTidytmbstrcasecmp(color,*(ctmbstr *)((long)&colors[1].name + lVar10));
        lVar9 = lVar10 + 0x10;
      } while (iVar7 != 0);
      p_Var11 = (_colors *)(lVar10 + 0x1c7730);
    }
LAB_0013dfc4:
    bVar14 = p_Var11->hex == (ctmbstr)0x0;
  }
  else {
    bVar14 = false;
  }
LAB_0013dfcd:
  if (!bVar14) {
    if (*color == '#') {
      ptVar8 = prvTidytmbstrtoupper(attval->value);
    }
    else {
      ptVar8 = prvTidytmbstrtolower(attval->value);
    }
    attval->value = ptVar8;
    return;
  }
  uVar6 = 0x22b;
LAB_0013e009:
  prvTidyReportAttrError(doc,node,attval,uVar6);
  return;
}

Assistant:

void CheckColor( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    Bool valid = no;
    tmbstr given;

    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    given = attval->value;

    /* 727851 - add hash to hash-less color values */
    if (given[0] != '#' && (valid = IsValidColorCode(given)))
    {
        tmbstr cp, s;

        cp = s = (tmbstr) TidyDocAlloc(doc, 2 + TY_(tmbstrlen)(given));
        *cp++ = '#';
        while ('\0' != (*cp++ = *given++))
            continue;

        TY_(ReportAttrError)(doc, node, attval, BAD_ATTRIBUTE_VALUE_REPLACED);

        TidyDocFree(doc, attval->value);
        given = attval->value = s;
    }

    if (!valid && given[0] == '#')
        valid = IsValidColorCode(given + 1);

    if (valid && given[0] == '#' && cfgBool(doc, TidyReplaceColor))
    {
        ctmbstr newName = GetColorName(given, TY_(IsHTML5Mode)(doc));

        if (newName)
        {
            TidyDocFree(doc, attval->value);
            given = attval->value = TY_(tmbstrdup)(doc->allocator, newName);
        }
    }

    /* if it is not a valid color code, it is a color name */
    if (!valid)
        valid = GetColorCode(given, TY_(IsHTML5Mode)(doc)) != NULL;

    if (valid && given[0] == '#')
        attval->value = TY_(tmbstrtoupper)(attval->value);
    else if (valid)
        attval->value = TY_(tmbstrtolower)(attval->value);

    if (!valid)
        TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
}